

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_model-base-ekf-flex-estimator-imu_withComBias_withForcesSensors.cpp
# Opt level: O2

int test(void)

{
  double *pdVar1;
  Index IVar2;
  uint uVar3;
  ostream *poVar4;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *pDVar5;
  Scalar *pSVar6;
  Matrix *pMVar7;
  long *plVar8;
  Matrix<double,__1,_1,_0,__1,_1> *src;
  ulong uVar9;
  uint time;
  long lVar10;
  uint k;
  IndexedMatrixArray *pIVar11;
  uint uVar12;
  IndexedMatrixArray *unaff_R15;
  Vector xPredicted;
  undefined1 local_1f18 [24];
  variable_if_dynamic<long,__1> vStack_1f00;
  variable_if_dynamic<long,__1> local_1ef8;
  variable_if_dynamic<long,__1> vStack_1ef0;
  double local_1ee8;
  Vector filteredZmp;
  Vector sensorZmp;
  Vector x;
  Matrix4 identity;
  Matrix Q_;
  Vector measurement;
  Vector input;
  Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> local_1de8 [2];
  Matrix R_;
  Matrix4 inputFeetPositionsk;
  IndexedMatrixArray filteredForces;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_1d28 [80];
  IndexedMatrixArray measurementForces;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_1cd0 [80];
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_6,_false> local_1c80;
  IndexedMatrixArray u;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_1c48 [80];
  IndexedMatrixArray y;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_1bf0 [80];
  IndexedMatrixArray nbSupport;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_1b98 [80];
  IndexedMatrixArray inputFeetPositions;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_1b40 [80];
  IndexedMatrixArray referenceZmp_output;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_1ae8 [80];
  IndexedMatrixArray filteredZmp_output;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_1a90 [80];
  IndexedMatrixArray sensorZmp_output;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_1a38 [80];
  IndexedMatrixArray u_output;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_19e0 [80];
  IndexedMatrixArray y_output;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_1988 [80];
  IndexedMatrixArray xPredicted_output;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_1930 [80];
  IndexedMatrixArray x_output;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_18d8 [80];
  IndexedMatrixArray zmpRef;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_1880 [80];
  IndexedMatrixArray bias;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_1828 [80];
  Vector6 measurementForcesk;
  Vector6 filteredForcesk;
  ModelBaseEKFFlexEstimatorIMU est;
  uint local_12bc;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"Starting");
  std::endl<char,std::char_traits<char>>(poVar4);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(&y);
  poVar4 = std::operator<<((ostream *)&std::cout,"Loading measurements file");
  std::endl<char,std::char_traits<char>>(poVar4);
  stateObservation::IndexedMatrixArray::getFromFile((char *)&y,0x12009b,1);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(&u);
  poVar4 = std::operator<<((ostream *)&std::cout,"Loading input file");
  std::endl<char,std::char_traits<char>>(poVar4);
  stateObservation::IndexedMatrixArray::getFromFile((char *)&u,0x1200c5,1);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(&nbSupport);
  poVar4 = std::operator<<((ostream *)&std::cout,"Loading the number of supports file");
  std::endl<char,std::char_traits<char>>(poVar4);
  stateObservation::IndexedMatrixArray::getFromFile((char *)&nbSupport,0x1200fa,1);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(&bias);
  poVar4 = std::operator<<((ostream *)&std::cout,"Loading comBias file");
  std::endl<char,std::char_traits<char>>(poVar4);
  stateObservation::IndexedMatrixArray::getFromFile((char *)&bias,0x120124,1);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(&zmpRef);
  poVar4 = std::operator<<((ostream *)&std::cout,"Loading zmpRef file");
  std::endl<char,std::char_traits<char>>(poVar4);
  stateObservation::IndexedMatrixArray::getFromFile((char *)&zmpRef,0x12014b,1);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(&x_output);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(&xPredicted_output);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(&y_output);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(&u_output);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(&sensorZmp_output);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(&filteredZmp_output);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(&referenceZmp_output);
  poVar4 = std::operator<<((ostream *)&std::cout,"Creating estimator");
  std::endl<char,std::char_traits<char>>(poVar4);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
  ModelBaseEKFFlexEstimatorIMU(&est,0.005);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setSamplingPeriod(0.005);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setContactModel((uint)&est)
  ;
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setRobotMass(56.8);
  _measurementForces = 40000;
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    *)&identity,(int *)&measurementForces,(StorageBaseType *)&filteredForces);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&inputFeetPositionsk,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
              *)&identity);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setKfe((Matrix *)&est);
  _measurementForces = 0x15e;
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    *)&identity,(int *)&measurementForces,(StorageBaseType *)&filteredForces);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&inputFeetPositionsk,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
              *)&identity);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setKte((Matrix *)&est);
  _measurementForces = 600;
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    *)&identity,(int *)&measurementForces,(StorageBaseType *)&filteredForces);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&inputFeetPositionsk,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
              *)&identity);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setKfv((Matrix *)&est);
  _measurementForces = 10;
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    *)&identity,(int *)&measurementForces,(StorageBaseType *)&filteredForces);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&inputFeetPositionsk,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
              *)&identity);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setKtv((Matrix *)&est);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setWithUnmodeledForces
            (SUB81(&est,0));
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setWithForcesMeasurements
            (SUB81(&est,0));
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setWithAbsolutePos
            (SUB81(&est,0));
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setWithComBias
            (SUB81(&est,0));
  poVar4 = std::operator<<((ostream *)&std::cout,"Setting covariances");
  std::endl<char,std::char_traits<char>>(poVar4);
  R_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  R_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  R_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&R_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,6,6);
  Eigen::internal::setIdentity_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>::run(&R_);
  identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       0.001;
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)&inputFeetPositionsk,
             &R_,0,0,3,3);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
  operator*=((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
             &inputFeetPositionsk,(Scalar *)&identity);
  identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       1e-06;
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)&inputFeetPositionsk,
             &R_,3,3,3,3);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
  operator*=((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
             &inputFeetPositionsk,(Scalar *)&identity);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
  setMeasurementNoiseCovariance((Matrix *)&est);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setUnmodeledForceVariance
            (1e-13);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setForceVariance(1e-06);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setAbsolutePosVariance
            (0.0001);
  Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,0x23,0x23);
  Eigen::internal::setIdentity_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>::run(&Q_);
  identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       1e-08;
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)&inputFeetPositionsk,
             &Q_,0,0,0xc,0xc);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
  operator*=((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
             &inputFeetPositionsk,(Scalar *)&identity);
  identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       0.0001;
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)&inputFeetPositionsk,
             &Q_,0xc,0xc,0xc,0xc);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
  operator*=((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
             &inputFeetPositionsk,(Scalar *)&identity);
  identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       0.01;
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)&inputFeetPositionsk,
             &Q_,0x18,0x18,6,6);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
  operator*=((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
             &inputFeetPositionsk,(Scalar *)&identity);
  identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       1e-07;
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)&inputFeetPositionsk,
             &Q_,0x1e,0x1e,2,2);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
  operator*=((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
             &inputFeetPositionsk,(Scalar *)&identity);
  identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       1e-08;
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)&inputFeetPositionsk,
             &Q_,0x20,0x20,3,3);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
  operator*=((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
             &inputFeetPositionsk,(Scalar *)&identity);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setProcessNoiseCovariance
            ((Matrix *)&est);
  input.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  input.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  measurement.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  measurement.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = (double *)0x0;
  x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,0x23);
  xPredicted.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  xPredicted.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&xPredicted.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,0x23);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(&measurementForces);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(&filteredForces);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(&inputFeetPositions);
  sensorZmp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  sensorZmp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  filteredZmp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  filteredZmp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  poVar4 = std::operator<<((ostream *)&std::cout,"Beginning reconstruction ");
  std::endl<char,std::char_traits<char>>(poVar4);
  lVar10 = 10000;
  while (uVar12 = (uint)unaff_R15, lVar10 != 0x2cec) {
    poVar4 = std::operator<<((ostream *)&std::cout,"\n");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
    time = (uint)lVar10;
    pDVar5 = (DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
             stateObservation::IndexedMatrixArray::operator[](&nbSupport,time);
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       (pDVar5,0);
    if ((*pSVar6 != (double)local_12bc) || (NAN(*pSVar6) || NAN((double)local_12bc))) {
      pDVar5 = (DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
               stateObservation::IndexedMatrixArray::operator[](&nbSupport,time);
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         (pDVar5,0);
      uVar12 = (uint)(long)*pSVar6;
      stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setContactsNumber
                ((uint)&est);
    }
    uVar3 = stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
            getMeasurementSize();
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&measurement.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (ulong)uVar3);
    pMVar7 = stateObservation::IndexedMatrixArray::operator[](&y,time);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_1f18,pMVar7,0
               ,0,1,(ulong)uVar3);
    identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6]
         = local_1ee8;
    identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4]
         = (double)local_1ef8.m_value;
    identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5]
         = (double)vStack_1ef0.m_value;
    identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
         = (double)local_1f18._16_8_;
    identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3]
         = (double)vStack_1f00.m_value;
    identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
         = (double)local_1f18._0_8_;
    identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
         = (double)local_1f18._8_8_;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>>
              (&measurement,
               (Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
               &identity);
    stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::setMeasurement
              ((Matrix *)&est);
    uVar3 = stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::getInputSize();
    uVar9 = (ulong)uVar3;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&input.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar9);
    lVar10 = lVar10 + 1;
    pMVar7 = stateObservation::IndexedMatrixArray::operator[](&u,(uint)lVar10);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_1f18,pMVar7,0
               ,0,1,uVar9);
    identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6]
         = local_1ee8;
    identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4]
         = (double)local_1ef8.m_value;
    identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5]
         = (double)vStack_1ef0.m_value;
    identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
         = (double)local_1f18._16_8_;
    identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3]
         = (double)vStack_1f00.m_value;
    identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
         = (double)local_1f18._0_8_;
    identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
         = (double)local_1f18._8_8_;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>>
              (&input,(Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                       *)&identity);
    stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::setMeasurementInput
              ((Matrix *)&est);
    stateObservation::flexibilityEstimation::EKFFlexibilityEstimatorBase::getEKF();
    plVar8 = (long *)stateObservation::ExtendedKalmanFilter::getFunctor();
    pMVar7 = stateObservation::IndexedMatrixArray::operator[](&u,time - 1);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_1f18,pMVar7,0
               ,0,1,uVar9);
    identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6]
         = local_1ee8;
    identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4]
         = (double)local_1ef8.m_value;
    identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5]
         = (double)vStack_1ef0.m_value;
    identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
         = (double)local_1f18._16_8_;
    identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3]
         = (double)vStack_1f00.m_value;
    identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
         = (double)local_1f18._0_8_;
    identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
         = (double)local_1f18._8_8_;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_1de8,
               (DenseBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>_>
                *)&identity);
    (**(code **)(*plVar8 + 0x10))(&local_1c80,plVar8,&x,local_1de8,0);
    IVar2 = xPredicted.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows;
    pdVar1 = xPredicted.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    xPredicted.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         local_1c80.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_6,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_6,_false,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_6,_false>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_6,_false>,_0>.
         m_data;
    xPredicted.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         local_1c80.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_6,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_6,_false,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_6,_false>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_6,_false>,_0>._8_8_
    ;
    local_1c80.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_6,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_6,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_6,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_6,_false>,_0>.m_data =
         pdVar1;
    local_1c80.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_6,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_6,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_6,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_6,_false>,_0>._8_8_ =
         IVar2;
    free(pdVar1);
    free(local_1de8[0].m_matrix);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&identity,&x,0xc,0xc);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_1f18,&xPredicted,0xc
               ,0xc);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)local_1f18,
               (Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&identity);
    src = (Matrix<double,__1,_1,_0,__1,_1> *)
          stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
          getFlexibilityVector();
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>(&x,src);
    unaff_R15 = (IndexedMatrixArray *)(ulong)uVar12;
    uVar9 = 0xc;
    uVar3 = 0x2a;
    for (pIVar11 = (IndexedMatrixArray *)0x0; unaff_R15 != pIVar11; pIVar11 = pIVar11 + 1) {
      pMVar7 = stateObservation::IndexedMatrixArray::operator[](&y,time);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_6,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_6,_false> *)local_1f18,pMVar7,0
                 ,(ulong)((int)uVar9 - 6));
      identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [4] = (double)local_1ef8.m_value;
      identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [5] = (double)vStack_1ef0.m_value;
      identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [2] = (double)local_1f18._16_8_;
      identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [3] = (double)vStack_1f00.m_value;
      identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0] = (double)local_1f18._0_8_;
      identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [1] = (double)local_1f18._8_8_;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,6,false>>>
                (&measurementForcesk,
                 (Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_6,_false>_> *)
                 &identity);
      Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_6>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_6> *)&identity,&x,uVar9,6);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,6,1,false>>
                (&filteredForcesk,
                 (Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_6,_1,_false> *)&identity);
      pMVar7 = stateObservation::IndexedMatrixArray::operator[](&u,time);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_6,_false>::Block
                (&local_1c80,pMVar7,0,(ulong)uVar3);
      Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
      PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,6,false>>
                ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)local_1f18,
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_6,_false>_> *)
                 &local_1c80);
      stateObservation::kine::vector6ToHomogeneousMatrix(&identity,(Vector6 *)local_1f18);
      local_1de8[0].m_matrix = (non_const_type)&identity;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Transpose<Eigen::Matrix<double,4,4,0,4,4>>>
                (&inputFeetPositionsk,local_1de8);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&identity,
                 (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&measurementForcesk);
      k = (uint)pIVar11;
      stateObservation::IndexedMatrixArray::setValue(&measurementForces,(Matrix *)&identity,k);
      free((void *)identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0]);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&identity,
                 (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&filteredForcesk);
      stateObservation::IndexedMatrixArray::setValue(&filteredForces,(Matrix *)&identity,k);
      free((void *)identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0]);
      Eigen::internal::setIdentity_impl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_true>::run
                ((Matrix<double,_4,_4,_0,_4,_4> *)&identity);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_1f18,
                 (DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&identity);
      stateObservation::IndexedMatrixArray::setValue(&inputFeetPositions,(Matrix *)local_1f18,k);
      free((void *)local_1f18._0_8_);
      uVar3 = uVar3 + 0xc;
      uVar9 = (ulong)((int)uVar9 + 6);
    }
    uVar3 = (uint)(PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&identity;
    computeZmp(uVar3,unaff_R15,&measurementForces);
    IVar2 = sensorZmp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows;
    pdVar1 = sensorZmp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    sensorZmp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)
         identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
         array[0];
    sensorZmp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         (Index)identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[1];
    identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
         = (double)pdVar1;
    identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
         = (double)IVar2;
    free(pdVar1);
    computeZmp(uVar3,(IndexedMatrixArray *)(ulong)uVar12,&filteredForces);
    IVar2 = filteredZmp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows;
    pdVar1 = filteredZmp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    filteredZmp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)
         identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
         array[0];
    filteredZmp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         (Index)identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[1];
    identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
         = (double)pdVar1;
    identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
         = (double)IVar2;
    free(pdVar1);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&identity,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&x);
    stateObservation::IndexedMatrixArray::setValue(&x_output,(Matrix *)&identity,time);
    free((void *)identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[0]);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&identity,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&xPredicted);
    stateObservation::IndexedMatrixArray::setValue(&xPredicted_output,(Matrix *)&identity,time);
    free((void *)identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[0]);
    pMVar7 = stateObservation::IndexedMatrixArray::operator[](&y,time);
    stateObservation::IndexedMatrixArray::setValue(&y_output,pMVar7,time);
    pMVar7 = stateObservation::IndexedMatrixArray::operator[](&u,time);
    stateObservation::IndexedMatrixArray::setValue(&u_output,pMVar7,time);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&identity,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&sensorZmp);
    stateObservation::IndexedMatrixArray::setValue(&sensorZmp_output,(Matrix *)&identity,time);
    free((void *)identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[0]);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&identity,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&filteredZmp);
    stateObservation::IndexedMatrixArray::setValue(&filteredZmp_output,(Matrix *)&identity,time);
    free((void *)identity.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[0]);
    pMVar7 = stateObservation::IndexedMatrixArray::operator[](&zmpRef,time);
    stateObservation::IndexedMatrixArray::setValue(&referenceZmp_output,pMVar7,time);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Completed ");
  std::endl<char,std::char_traits<char>>(poVar4);
  stateObservation::IndexedMatrixArray::writeInFile((char *)&x_output);
  stateObservation::IndexedMatrixArray::writeInFile((char *)&xPredicted_output);
  stateObservation::IndexedMatrixArray::writeInFile((char *)&y_output);
  stateObservation::IndexedMatrixArray::writeInFile((char *)&u_output);
  stateObservation::IndexedMatrixArray::writeInFile((char *)&sensorZmp_output);
  stateObservation::IndexedMatrixArray::writeInFile((char *)&filteredZmp_output);
  stateObservation::IndexedMatrixArray::writeInFile((char *)&referenceZmp_output);
  free(filteredZmp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(sensorZmp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(local_1b40);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(local_1d28);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(local_1cd0);
  free(xPredicted.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(measurement.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(input.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(R_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
  ~ModelBaseEKFFlexEstimatorIMU(&est);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(local_1ae8);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(local_1a90);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(local_1a38);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(local_19e0);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(local_1988);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(local_1930);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(local_18d8);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(local_1880);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(local_1828);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(local_1b98);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(local_1c48);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(local_1bf0);
  return 1;
}

Assistant:

int test()
{
    std::cout << "Starting" << std::endl;

    // For measurement vector
    bool withUnmodeledForces_ = false;
    bool withForceSensors_=true;
    bool withAbsolutePose_ = false;

    // For state vector
    bool withComBias_=false;

    // Time
    const double dt=5e-3;
    const unsigned kinit=10000; //3500; //3758; //
    const unsigned kmax=11500; //5700; //5100; //

    // Fix sizes
    const unsigned measurementSizeBase=6;
    const unsigned inputSizeBase=42;
    const unsigned stateSize=35;

    /// Definitions of input vectors
     // Measurement
     IndexedMatrixArray y;
     std::cout << "Loading measurements file" << std::endl;
     y.getFromFile("source_measurement.dat",1,30);

     // Input
     IndexedMatrixArray u;
     std::cout << "Loading input file" << std::endl;
     u.getFromFile("source_input.dat",1,66);

     // Number of support contacts
     IndexedMatrixArray nbSupport;
     std::cout << "Loading the number of supports file" << std::endl;
     nbSupport.getFromFile("source_nbSupport.dat",1,1);

     // CoM bias
     IndexedMatrixArray bias;
     std::cout << "Loading comBias file" << std::endl;
     bias.getFromFile("source_comBias.dat",1,35);

     // Zmp ref
     IndexedMatrixArray zmpRef;
     std::cout << "Loading zmpRef file" << std::endl;
     zmpRef.getFromFile("source_zmpRef.dat",1,3);

    /// Definition of ouptut vectors 
     // State: what we want
     IndexedMatrixArray x_output;
     // State: what we want
     IndexedMatrixArray xPredicted_output;
     // Measurement
     IndexedMatrixArray y_output;
     // Input
     IndexedMatrixArray u_output;

     // Zmp from sensors
     IndexedMatrixArray sensorZmp_output;
     // Zmp from filter
     IndexedMatrixArray filteredZmp_output;
     // reference Zmp
     IndexedMatrixArray referenceZmp_output;

    std::cout << "Creating estimator" <<std::endl;

    stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU est;
    est.setSamplingPeriod(dt);

    // Model
    est.setContactModel(1);
    est.setRobotMass(56.8);
    est.setKfe(40000*Matrix3::Identity());
    est.setKte(350*Matrix3::Identity());
    est.setKfv(600*Matrix3::Identity());
    est.setKtv(10*Matrix3::Identity());

    // Config
    est.setWithUnmodeledForces(withUnmodeledForces_);
    est.setWithForcesMeasurements(withForceSensors_);
    est.setWithAbsolutePos(withAbsolutePose_);
    est.setWithComBias(withComBias_);

    std::cout << "Setting covariances" << std::endl;

    // Measurement noise covariance
    stateObservation::Matrix R_; R_.resize(measurementSizeBase,measurementSizeBase); R_.setIdentity();
    R_.block(0,0,3,3)*=1.e-3;
    R_.block(3,3,3,3)*=1.e-6;
    est.setMeasurementNoiseCovariance(R_);
    est.setUnmodeledForceVariance(1e-13);
    est.setForceVariance(1.e-6);
    est.setAbsolutePosVariance(1e-4);

    // Process noise covariance
    stateObservation::Matrix Q_; Q_.resize(stateSize,stateSize); Q_.setIdentity();
    Q_.block(0,0,12,12)*=1.e-8;
    Q_.block(12,12,12,12)*=1.e-4;
    Q_.block(24,24,6,6)*=1.e-2;
    Q_.block(30,30,2,2)*=1.e-7;
    Q_.block(32,32,3,3)*=1.e-8;
    est.setProcessNoiseCovariance(Q_);

    // Temporary variables
    stateObservation::Vector input, measurement;
    Vector x; x.resize(stateSize);
    Vector xPredicted; xPredicted.resize(stateSize);
    unsigned contactNbr, inputSize, measurementSize;

    stateObservation::IndexedMatrixArray measurementForces, filteredForces, inputFeetPositions;
    stateObservation::Vector sensorZmp, filteredZmp;
    stateObservation::Vector6 filteredForcesk, measurementForcesk;
    stateObservation::Matrix4 inputFeetPositionsk;

    std::cout << "Beginning reconstruction "<<std::endl;

    for (unsigned k=kinit;k<kmax;++k)
    {
        std::cout << "\n" << k << std::endl;   

        if(nbSupport[k](0)!=est.getContactsNumber())
        {
            contactNbr = nbSupport[k](0);
            est.setContactsNumber(contactNbr);
        }

        measurementSize = est.getMeasurementSize();
        measurement.resize(measurementSize);
        measurement = (y[k].block(0,0,1,measurementSize)).transpose();
        est.setMeasurement(measurement);

        inputSize = est.getInputSize();
        input.resize(inputSize);
        input = (u[k+1].block(0,0,1,inputSize)).transpose();
        est.setMeasurementInput(input);

        xPredicted = est.getEKF().getFunctor()->stateDynamics(x,(u[k-1].block(0,0,1,inputSize)).transpose(),0);
        xPredicted.segment(stateObservation::flexibilityEstimation::IMUElasticLocalFrameDynamicalSystem::state::fc,12)
               = x.segment(stateObservation::flexibilityEstimation::IMUElasticLocalFrameDynamicalSystem::state::fc,12);

        x = est.getFlexibilityVector();

        // Compute Zmp from sensor and filter
        for(unsigned i=0;i<contactNbr;++i)
        {
            measurementForcesk = y[k].block<1,6>(0,measurementSizeBase+withUnmodeledForces_*6+i*6).transpose();
            filteredForcesk = x.segment<6>(stateObservation::flexibilityEstimation::IMUElasticLocalFrameDynamicalSystem::state::fc+i*6);
            inputFeetPositionsk = kine::vector6ToHomogeneousMatrix(u[k].block<1,6>(0,inputSizeBase+i*12)).transpose();

//            measurementForcesk.segment<3>(0) = inputFeetPositionsk.block(0,0,3,3).transpose()*measurementForcesk.segment<3>(0);
//            measurementForcesk.segment<3>(3) = inputFeetPositionsk.block(0,0,3,3).transpose()*measurementForcesk.segment<3>(3)
//                                               +kine::skewSymmetric(inputFeetPositionsk.block(0,0,3,3).transpose()*inputFeetPositionsk.block(0,3,3,1))*measurementForcesk.segment<3>(0);
//
//            filteredForcesk.segment<3>(0) = inputFeetPositionsk.block(0,0,3,3).transpose()*filteredForcesk.segment<3>(0);
//            filteredForcesk.segment<3>(3) = inputFeetPositionsk.block(0,0,3,3).transpose()*filteredForcesk.segment<3>(3)
//                                               -kine::skewSymmetric(inputFeetPositionsk.block(0,0,3,3).transpose()*inputFeetPositionsk.block(0,3,3,1))*filteredForcesk.segment<3>(0);

            measurementForces.setValue(measurementForcesk,i);
            filteredForces.setValue(filteredForcesk,i);
            stateObservation::Matrix4 identity; identity.setIdentity();
            inputFeetPositions.setValue(identity,i);
        }
        sensorZmp=computeZmp(contactNbr, measurementForces, inputFeetPositions);
        filteredZmp=computeZmp(contactNbr, filteredForces, inputFeetPositions);

        x_output.setValue(x,k);
        xPredicted_output.setValue(xPredicted,k);
        y_output.setValue(y[k],k);
        u_output.setValue(u[k],k);
        sensorZmp_output.setValue(sensorZmp,k);
        filteredZmp_output.setValue(filteredZmp,k);
        referenceZmp_output.setValue(zmpRef[k],k);
    }

    std::cout << "Completed "<<std::endl;

    x_output.writeInFile("state.dat");
    xPredicted_output.writeInFile("statePredicted.dat");
    y_output.writeInFile("measurement.dat");
    u_output.writeInFile("input.dat");
    sensorZmp_output.writeInFile("sensorZmp.dat");
    filteredZmp_output.writeInFile("filteredZmp.dat");
    referenceZmp_output.writeInFile("referenceZmp.dat");

    return 1;
}